

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

void Eigen::internal::
     partial_lu_inplace<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpositions<_1,_1,int>>
               (Matrix<double,__1,__1,_0,__1,__1> *lu,
               Transpositions<_1,__1,_int> *row_transpositions,StorageIndex *nb_transpositions)

{
  Index IVar1;
  Index IVar2;
  StorageIndex *pSVar3;
  StorageIndex *pSVar4;
  Index cols;
  Scalar *lu_data;
  Index luStride;
  bool bVar5;
  StorageIndex *nb_transpositions_local;
  Transpositions<_1,__1,_int> *row_transpositions_local;
  Matrix<double,__1,__1,_0,__1,__1> *lu_local;
  
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if ((IVar1 == 0) ||
     (IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>),
     IVar1 == 0)) {
    *nb_transpositions = 0;
    return;
  }
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar2 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::size
                    ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)row_transpositions);
  if (IVar1 != IVar2) {
    __assert_fail("lu.cols() == row_transpositions.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/LU/PartialPivLU.h"
                  ,0x200,
                  "void Eigen::internal::partial_lu_inplace(MatrixType &, TranspositionType &, typename TranspositionType::StorageIndex &) [MatrixType = Eigen::Matrix<double, -1, -1>, TranspositionType = Eigen::Transpositions<-1, -1>]"
                 );
  }
  IVar2 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::size
                    ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)row_transpositions);
  bVar5 = true;
  if (1 < IVar2) {
    pSVar3 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeffRef
                       ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)
                        row_transpositions,1);
    pSVar4 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeffRef
                       ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)
                        row_transpositions,0);
    bVar5 = (long)pSVar3 - (long)pSVar4 >> 2 == 1;
  }
  if (bVar5) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    cols = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                     (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    lu_data = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                        (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0,0);
    luStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride(lu);
    pSVar3 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeffRef
                       ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)
                        row_transpositions,0);
    partial_lu_impl<double,_0,_int,_-1>::blocked_lu
              (IVar1,cols,lu_data,luStride,pSVar3,nb_transpositions,0x100);
    return;
  }
  __assert_fail("row_transpositions.size() < 2 || (&row_transpositions.coeffRef(1)-&row_transpositions.coeffRef(0)) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/LU/PartialPivLU.h"
                ,0x201,
                "void Eigen::internal::partial_lu_inplace(MatrixType &, TranspositionType &, typename TranspositionType::StorageIndex &) [MatrixType = Eigen::Matrix<double, -1, -1>, TranspositionType = Eigen::Transpositions<-1, -1>]"
               );
}

Assistant:

void partial_lu_inplace(MatrixType& lu, TranspositionType& row_transpositions, typename TranspositionType::StorageIndex& nb_transpositions)
{
  // Special-case of zero matrix.
  if (lu.rows() == 0 || lu.cols() == 0) {
    nb_transpositions = 0;
    return;
  }
  eigen_assert(lu.cols() == row_transpositions.size());
  eigen_assert(row_transpositions.size() < 2 || (&row_transpositions.coeffRef(1)-&row_transpositions.coeffRef(0)) == 1);

  partial_lu_impl
    < typename MatrixType::Scalar, MatrixType::Flags&RowMajorBit?RowMajor:ColMajor,
      typename TranspositionType::StorageIndex,
      EIGEN_SIZE_MIN_PREFER_FIXED(MatrixType::RowsAtCompileTime,MatrixType::ColsAtCompileTime)>
    ::blocked_lu(lu.rows(), lu.cols(), &lu.coeffRef(0,0), lu.outerStride(), &row_transpositions.coeffRef(0), nb_transpositions);
}